

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

void tmvline4_revsubclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  byte *pbVar11;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar6 = dc_dest;
  iVar5 = dc_count;
  do {
    lVar9 = 0;
    lVar10 = 0;
    pbVar11 = pbVar6;
    do {
      uVar8 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar9) +
                              (ulong)(*(uint *)((long)vplce + lVar10) >> ((byte)iVar3 & 0x3f)));
      if (uVar8 != 0) {
        uVar7 = (pDVar2[*pbVar11] | 0x40100400) -
                pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar8)];
        uVar4 = uVar7 & 0x40100400;
        uVar4 = uVar4 - (uVar4 >> 5) & uVar7 | 0x1f07c1f;
        *pbVar11 = RGB32k.All[uVar4 >> 0xf & uVar4];
      }
      *(int *)((long)vplce + lVar10) =
           *(int *)((long)vplce + lVar10) + *(int *)((long)vince + lVar10);
      lVar10 = lVar10 + 4;
      lVar9 = lVar9 + 8;
      pbVar11 = pbVar11 + 1;
    } while (lVar10 != 0x10);
    pbVar6 = pbVar6 + dc_pitch;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void tmvline4_revsubclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = (bg2rgb[dest[i]] | 0x40100400) - fg2rgb[palookupoffse[i][pix]];
				DWORD b = a;

				b &= 0x40100400;
				b = b - (b >> 5);
				a &= b;
				a |= 0x01f07c1f;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}